

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

void __thiscall Fl_Tabs::draw(Fl_Tabs *this)

{
  byte bVar1;
  int H_00;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Color FVar7;
  int iVar8;
  Fl_Widget *widget;
  Fl_Widget **ppFVar9;
  int local_68;
  int local_64;
  int local_54;
  Fl_Color local_44;
  Fl_Widget **a;
  int i;
  int selected;
  int nc;
  int clip_y;
  Fl_Color c;
  int H;
  Fl_Widget *v;
  Fl_Tabs *this_local;
  
  widget = value(this);
  H_00 = tab_height(this);
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) == 0) {
    if (widget != (Fl_Widget *)0x0) {
      Fl_Group::update_child(&this->super_Fl_Group,widget);
    }
  }
  else {
    if (widget == (Fl_Widget *)0x0) {
      local_44 = Fl_Widget::color((Fl_Widget *)this);
    }
    else {
      local_44 = Fl_Widget::color(widget);
    }
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    local_54 = H_00;
    if (H_00 < 0) {
      local_54 = 0;
    }
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    local_64 = H_00;
    if (H_00 < 0) {
      local_64 = -H_00;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar3,iVar4 + local_54,iVar5,iVar6 - local_64,
                        local_44);
    FVar7 = Fl_Widget::selection_color((Fl_Widget *)this);
    if (FVar7 != local_44) {
      if (H_00 < 0) {
        iVar3 = Fl_Widget::y((Fl_Widget *)this);
        iVar4 = Fl_Widget::h((Fl_Widget *)this);
        local_68 = iVar3 + iVar4 + H_00 + -5;
      }
      else {
        local_68 = Fl_Widget::y((Fl_Widget *)this);
        local_68 = local_68 + H_00;
      }
      iVar3 = Fl_Widget::x((Fl_Widget *)this);
      iVar4 = Fl_Widget::w((Fl_Widget *)this);
      fl_push_clip(iVar3,local_68,iVar4,5);
      FVar2 = Fl_Widget::box((Fl_Widget *)this);
      iVar3 = Fl_Widget::x((Fl_Widget *)this);
      iVar4 = Fl_Widget::w((Fl_Widget *)this);
      FVar7 = Fl_Widget::selection_color((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar3,local_68,iVar4,5,FVar7);
      fl_pop_clip();
    }
    if (widget != (Fl_Widget *)0x0) {
      Fl_Group::draw_child(&this->super_Fl_Group,widget);
    }
  }
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x84) != 0) {
    iVar3 = Fl_Group::children(&this->super_Fl_Group);
    iVar4 = tab_positions(this);
    ppFVar9 = Fl_Group::array(&this->super_Fl_Group);
    for (a._0_4_ = 0; (int)a < iVar4; a._0_4_ = (int)a + 1) {
      iVar6 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = this->tab_pos[(int)a];
      iVar8 = Fl_Widget::x((Fl_Widget *)this);
      draw_tab(this,iVar6 + iVar5,iVar8 + this->tab_pos[(int)a + 1],this->tab_width[(int)a],H_00,
               ppFVar9[(int)a],0);
    }
    while (a._0_4_ = iVar3 + -1, iVar4 < (int)a) {
      iVar6 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = this->tab_pos[(int)a];
      iVar8 = Fl_Widget::x((Fl_Widget *)this);
      draw_tab(this,iVar6 + iVar5,iVar8 + this->tab_pos[iVar3],this->tab_width[(int)a],H_00,
               ppFVar9[(int)a],1);
      iVar3 = (int)a;
    }
    if (widget != (Fl_Widget *)0x0) {
      iVar5 = Fl_Widget::x((Fl_Widget *)this);
      iVar3 = this->tab_pos[iVar4];
      iVar6 = Fl_Widget::x((Fl_Widget *)this);
      draw_tab(this,iVar5 + iVar3,iVar6 + this->tab_pos[iVar4 + 1],this->tab_width[iVar4],H_00,
               ppFVar9[iVar4],2);
    }
  }
  return;
}

Assistant:

void Fl_Tabs::draw() {
  Fl_Widget *v = value();
  int H = tab_height();

  if (damage() & FL_DAMAGE_ALL) { // redraw the entire thing:
    Fl_Color c = v ? v->color() : color();

    draw_box(box(), x(), y()+(H>=0?H:0), w(), h()-(H>=0?H:-H), c);

    if (selection_color() != c) {
      // Draw the top or bottom SELECTION_BORDER lines of the tab pane in the
      // selection color so that the user knows which tab is selected...
      int clip_y = (H >= 0) ? y() + H : y() + h() + H - SELECTION_BORDER;
      fl_push_clip(x(), clip_y, w(), SELECTION_BORDER);
      draw_box(box(), x(), clip_y, w(), SELECTION_BORDER, selection_color());
      fl_pop_clip();
    }
    if (v) draw_child(*v);
  } else { // redraw the child
    if (v) update_child(*v);
  }
  if (damage() & (FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) {
    const int nc = children();
    int selected = tab_positions();
    int i;
    Fl_Widget*const* a = array();
    for (i=0; i<selected; i++)
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], LEFT);
    for (i=nc-1; i > selected; i--)
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], RIGHT);
    if (v) {
      i = selected;
      draw_tab(x()+tab_pos[i], x()+tab_pos[i+1],
               tab_width[i], H, a[i], SELECTED);
    }
  }
}